

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status
fdb_kvs_open(fdb_file_handle *fhandle,fdb_kvs_handle **ptr_handle,char *kvs_name,
            fdb_kvs_config *kvs_config)

{
  fdb_kvs_handle *handle_00;
  bool bVar1;
  int iVar2;
  undefined8 *__ptr;
  fdb_kvs_config *in_RCX;
  char *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  kvs_header *kvsh;
  void *default_kvs_cmp_param;
  fdb_custom_cmp_variable default_kvs_cmp;
  filemgr *latest_file;
  filemgr *file;
  fdb_kvs_config config_local;
  fdb_kvs_handle *root_handle;
  fdb_status fs;
  fdb_config config;
  fdb_kvs_handle *handle;
  fdb_config *in_stack_00001ab0;
  fdb_filename_mode_t in_stack_00001abc;
  char *in_stack_00001ac0;
  fdb_kvs_handle *in_stack_00001ac8;
  fdb_kvs_handle *in_stack_fffffffffffffe28;
  fdb_file_handle *in_stack_fffffffffffffe30;
  void **in_stack_fffffffffffffe38;
  fdb_file_handle *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  fdb_kvs_handle *in_stack_fffffffffffffe50;
  char *local_1a0;
  char *in_stack_fffffffffffffe70;
  kvs_header *pkVar3;
  char *in_stack_fffffffffffffe78;
  void *pvVar4;
  filemgr *in_stack_fffffffffffffe80;
  fdb_custom_cmp_variable p_Var5;
  fdb_kvs_handle *in_stack_fffffffffffffe88;
  fdb_config *in_stack_fffffffffffffe90;
  fdb_kvs_handle *in_stack_fffffffffffffe98;
  fdb_kvs_handle *handle_01;
  fdb_config *local_148;
  fdb_kvs_handle *local_140;
  fdb_kvs_handle *in_stack_fffffffffffffed8;
  byte local_e8;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    handle_00 = (fdb_kvs_handle *)*in_RDI;
    memcpy(&stack0xfffffffffffffed8,&handle_00->config,0xf8);
    if (in_RCX == (fdb_kvs_config *)0x0) {
      get_default_kvs_config();
      handle_01 = in_stack_fffffffffffffe88;
      local_148 = in_stack_fffffffffffffe90;
      local_140 = in_stack_fffffffffffffe98;
    }
    else {
      bVar1 = validate_fdb_kvs_config(in_RCX);
      if (!bVar1) {
        return FDB_RESULT_INVALID_CONFIG;
      }
      local_148 = (fdb_config *)in_RCX->custom_cmp;
      local_140 = (fdb_kvs_handle *)in_RCX->custom_cmp_param;
      handle_01 = *(fdb_kvs_handle **)in_RCX;
    }
    fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
    fdb_sync_db_header(in_stack_fffffffffffffed8);
    if ((in_RDX == (char *)0x0) || (iVar2 = strcmp(in_RDX,default_kvs_name), iVar2 == 0)) {
      pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 4));
      if ((in_RDI[3] & 1U) == 0) {
        p_Var5 = (fdb_custom_cmp_variable)0x0;
        pvVar4 = (void *)0x0;
        *(fdb_kvs_handle **)&handle_00->kvs_config = handle_01;
        (handle_00->kvs_config).custom_cmp = (fdb_custom_cmp_variable)local_148;
        (handle_00->kvs_config).custom_cmp_param = local_140;
        if (handle_00->file->kv_header != (kvs_header *)0x0) {
          pkVar3 = handle_00->file->kv_header;
          fdb_kvs_find_cmp_name
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     (fdb_custom_cmp_variable *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
          ;
          pthread_spin_lock(&pkVar3->lock);
          pkVar3->default_kvs_cmp = p_Var5;
          pkVar3->default_kvs_cmp_param = pvVar4;
          if ((pkVar3->default_kvs_cmp == (fdb_custom_cmp_variable)0x0) &&
             ((handle_00->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0)) {
            pkVar3->default_kvs_cmp = (handle_00->kvs_config).custom_cmp;
            pkVar3->default_kvs_cmp_param = (handle_00->kvs_config).custom_cmp_param;
            fdb_file_handle_add_cmp_func
                      (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                       (fdb_custom_cmp_variable)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
            ;
          }
          if (pkVar3->default_kvs_cmp != (fdb_custom_cmp_variable)0x0) {
            pkVar3->custom_cmp_enabled = '\x01';
            in_RDI[3] = in_RDI[3] | 4;
          }
          pthread_spin_unlock(&handle_00->file->kv_header->lock);
        }
        in_RDI[3] = in_RDI[3] | 2;
        in_RDI[3] = in_RDI[3] | 1;
      }
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 4));
      __ptr = (undefined8 *)calloc(1,0x208);
      *__ptr = handle_01;
      __ptr[1] = local_148;
      __ptr[2] = local_140;
      atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe30,
                          (uint8_t)((ulong)in_stack_fffffffffffffe28 >> 0x38));
      __ptr[5] = in_RDI;
      local_4 = _fdb_open(in_stack_00001ac8,in_stack_00001ac0,in_stack_00001abc,in_stack_00001ab0);
      if (local_4 == FDB_RESULT_SUCCESS) {
        _fdb_kvs_createNLinkKVHandle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        *in_RSI = __ptr;
      }
      else {
        free(__ptr);
        *in_RSI = 0;
      }
    }
    else if ((local_e8 & 1) == 0) {
      local_1a0 = in_RDX;
      if (in_RDX == (char *)0x0) {
        local_1a0 = "default";
      }
      local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_CONFIG,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                             ,"fdb_kvs_open",0x70c,
                             "Cannot open KV store instance \'%s\' because multi-KV store instance mode is disabled."
                             ,local_1a0);
    }
    else if (handle_00->kvs->type == '\0') {
      if (handle_00->shandle == (snap_handle *)0x0) {
        pvVar4 = calloc(1,0x208);
        if (pvVar4 == (void *)0x0) {
          local_4 = FDB_RESULT_ALLOC_FAIL;
        }
        else {
          atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe30,
                              (uint8_t)((ulong)in_stack_fffffffffffffe28 >> 0x38));
          *(long **)((long)pvVar4 + 0x28) = in_RDI;
          local_4 = _fdb_kvs_open(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                  &in_stack_fffffffffffffe88->kvs_config,in_stack_fffffffffffffe80,
                                  in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,handle_01);
          if (local_4 == FDB_RESULT_SUCCESS) {
            *in_RSI = pvVar4;
          }
          else {
            *in_RSI = 0;
            free(pvVar4);
          }
        }
      }
      else {
        if (in_RDX == (char *)0x0) {
          in_RDX = "default";
        }
        local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_ARGS,
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                               ,"fdb_kvs_open",0x71b,
                               "Not allowed to open KV store instance \'%s\' from the snapshot handle."
                               ,in_RDX);
      }
    }
    else {
      if (in_RDX == (char *)0x0) {
        in_RDX = "default";
      }
      local_4 = fdb_log_impl(&handle_00->log_callback,2,FDB_RESULT_INVALID_HANDLE,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                             ,"fdb_kvs_open",0x713,
                             "Cannot open KV store instance \'%s\' because the handle doesn\'t support multi-KV sotre instance mode."
                             ,in_RDX);
    }
  }
  return local_4;
}

Assistant:

fdb_status _fdb_kvs_open(fdb_kvs_handle *root_handle,
                         fdb_config *config,
                         fdb_kvs_config *kvs_config,
                         struct filemgr *file,
                         const char *filename,
                         const char *kvs_name,
                         fdb_kvs_handle *handle)
{
    fdb_status fs;

    if (handle->kvs == NULL) {
        // create kvs_info
        fdb_kvs_info_create(root_handle, handle, file, kvs_name);
    }

    if (handle->kvs == NULL) {
        // KV instance name is not found
        if (!kvs_config->create_if_missing) {
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_KV_INSTANCE_NAME,
                           "Failed to open KV store '%s' because it doesn't exist.",
                           kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }
        if (root_handle->config.flags == FDB_OPEN_FLAG_RDONLY) {
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_RONLY_VIOLATION,
                           "Failed to create KV store '%s' because the KV store's handle "
                           "is read-only.", kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }

        // create
        fs = _fdb_kvs_create(root_handle, kvs_name, kvs_config);
        if (fs != FDB_RESULT_SUCCESS) { // create fail
            return FDB_RESULT_INVALID_KV_INSTANCE_NAME;
        }
        // create kvs_info again
        fdb_kvs_info_create(root_handle, handle, file, kvs_name);
        if (handle->kvs == NULL) { // fail again
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_KV_INSTANCE_NAME,
                           "Failed to create KV store '%s' because the KV store's handle "
                           "is read-only.", kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }
    }
    handle->kvs_config = *kvs_config;
    fs = _fdb_open(handle, filename, FDB_AFILENAME, config);
    if (fs != FDB_RESULT_SUCCESS) {
        if (handle->node) {
            spin_lock(&root_handle->fhandle->lock);
            list_remove(root_handle->fhandle->handles, &handle->node->le);
            spin_unlock(&root_handle->fhandle->lock);
            free(handle->node);
        } // 'handle->node == NULL' happens only during rollback
        free(handle->kvs);
    }
    return fs;
}